

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methodarea.cpp
# Opt level: O2

ClassRuntime * __thiscall MethodArea::loadClassNamed(MethodArea *this,string *className)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  ClassRuntime *pCVar4;
  FILE *__stream;
  ClassLoader *this_00;
  ClassFile *classFile;
  ExecutionEngine *this_01;
  VMStack *this_02;
  Frame *this_03;
  ostream *poVar5;
  string classNameStr;
  string classFormat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  _Vector_base<Value,_std::allocator<Value>_> local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string classLocation;
  
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClassRuntime_*>_>_>
          ::count(&this->_classes,className);
  if (sVar3 != 0) {
    pCVar4 = getClassNamed(this,className);
    return pCVar4;
  }
  std::__cxx11::string::string((string *)&classNameStr,(string *)className);
  std::__cxx11::string::string((string *)&classLocation,"",(allocator *)&classFormat);
  std::__cxx11::string::string((string *)&classFormat,".class",(allocator *)&local_108);
  if (classFormat._M_string_length <= classNameStr._M_string_length) {
    iVar2 = std::__cxx11::string::compare
                      ((ulong)&classNameStr,
                       classNameStr._M_string_length - classFormat._M_string_length,
                       (string *)classFormat._M_string_length);
    if (iVar2 == 0) goto LAB_00113d68;
  }
  std::operator+(&local_128,&classLocation,&classNameStr);
  std::operator+(&local_108,&local_128,&classFormat);
  std::__cxx11::string::operator=((string *)&classNameStr,(string *)&local_108);
  std::__cxx11::string::~string((string *)&local_108);
  std::__cxx11::string::~string((string *)&local_128);
LAB_00113d68:
  __stream = fopen(classNameStr._M_dataplus._M_p,"rb");
  if (__stream != (FILE *)0x0) {
    this_00 = ClassLoader::getInstance();
    classFile = ClassLoader::readClassFile(this_00,(FILE *)__stream);
    pCVar4 = (ClassRuntime *)operator_new(0x38);
    ClassRuntime::ClassRuntime(pCVar4,classFile);
    addClass(this,pCVar4);
    fclose(__stream);
    this_01 = ExecutionEngine::getInstance();
    std::__cxx11::string::string((string *)&local_68,"<clinit>",(allocator *)&local_108);
    std::__cxx11::string::string((string *)&local_88,"()V",(allocator *)&local_128);
    bVar1 = ExecutionEngine::doesMethodExist(this_01,pCVar4,&local_68,&local_88);
    std::__cxx11::string::~string((string *)&local_88);
    std::__cxx11::string::~string((string *)&local_68);
    if (bVar1) {
      this_02 = VMStack::getInstance();
      this_03 = (Frame *)operator_new(0xb8);
      std::__cxx11::string::string((string *)&local_a8,"<clinit>",(allocator *)&local_108);
      std::__cxx11::string::string((string *)&local_c8,"()V",(allocator *)&local_128);
      local_e8._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_e8._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      Frame::Frame(this_03,pCVar4,&local_a8,&local_c8,
                   (vector<Value,_std::allocator<Value>_> *)&local_e8);
      std::_Vector_base<Value,_std::allocator<Value>_>::~_Vector_base(&local_e8);
      std::__cxx11::string::~string((string *)&local_c8);
      std::__cxx11::string::~string((string *)&local_a8);
      VMStack::addFrame(this_02,this_03);
    }
    std::__cxx11::string::~string((string *)&classFormat);
    std::__cxx11::string::~string((string *)&classLocation);
    std::__cxx11::string::~string((string *)&classNameStr);
    return pCVar4;
  }
  poVar5 = std::operator<<((ostream *)&std::cerr,"NoClassDefFoundError: ");
  poVar5 = std::operator<<(poVar5,(string *)&classNameStr);
  std::endl<char,std::char_traits<char>>(poVar5);
  exit(1);
}

Assistant:

ClassRuntime* MethodArea::loadClassNamed(const string &className) {
    // se a classe já tiver sido carregada, retorna-la
    if (_classes.count(className) > 0) {
        return getClassNamed(className);
    }
    
    string classNameStr(className);
    string classLocation("");
    string classFormat(".class");
    
    if (classNameStr.size() < classFormat.size() || classNameStr.compare(classNameStr.size() - classFormat.size(), classFormat.size(), classFormat) != 0) {
        classNameStr = classLocation + classNameStr + classFormat; // concatena com ".class"
    }

    FILE *fp = fopen(classNameStr.c_str(), "rb");
    if (fp == NULL) {
        cerr << "NoClassDefFoundError: " << classNameStr << endl;
        exit(1);
    }
    
    ClassLoader &classLoader = ClassLoader::getInstance();
    ClassFile *classFile = classLoader.readClassFile(fp);
    ClassRuntime *classRuntime = new ClassRuntime(classFile);
    addClass(classRuntime);
    fclose(fp);
    
    // adicionando <clinit> da classe (se existir) na stack frame.
    ExecutionEngine &executionEngine = ExecutionEngine::getInstance();
    bool existsClinit = executionEngine.doesMethodExist(classRuntime, "<clinit>", "()V");
    if (existsClinit) {
        VMStack &stackFrame = VMStack::getInstance();
        Frame *newFrame = new Frame(classRuntime, "<clinit>", "()V");
        stackFrame.addFrame(newFrame);
    }
    
    return classRuntime;
}